

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linit.c
# Opt level: O2

void luaL_openlibs(lua_State *L)

{
  lua_CFunction *pp_Var1;
  
  for (pp_Var1 = &loadedlibs[0].func; *pp_Var1 != (lua_CFunction)0x0; pp_Var1 = pp_Var1 + 2) {
    luaL_requiref(L,((luaL_Reg *)(pp_Var1 + -1))->name,*pp_Var1,1);
    lua_settop(L,-2);
  }
  return;
}

Assistant:

LUALIB_API void luaL_openlibs (lua_State *L) {
  const luaL_Reg *lib;
  /* "require" functions from 'loadedlibs' and set results to global table */
  for (lib = loadedlibs; lib->func; lib++) {
    luaL_requiref(L, lib->name, lib->func, 1);
    lua_pop(L, 1);  /* remove lib */
  }
}